

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall
streams_tests::streams_buffered_file_skip::test_method(streams_buffered_file_skip *this)

{
  long lVar1;
  FILE *__stream;
  size_t in_RCX;
  size_t sVar2;
  ulong uVar3;
  char cVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar7;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined4 local_1b4;
  uint64_t local_1b0;
  undefined1 local_1a8 [16];
  undefined1 *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  uint8_t i;
  BufferedFile local_160;
  AutoFile local_120;
  uint64_t *local_100;
  assertion_result local_f8;
  uint64_t **local_e0;
  uint64_t *local_d8;
  uint8_t obj;
  bool local_c8;
  undefined1 *local_c0;
  lazy_ostream *local_b8;
  char *local_b0;
  char *local_a8;
  assertion_result local_a0;
  path local_88;
  path streams_test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x10,"streams_test_tmp");
  std::filesystem::__cxx11::path::path(&streams_test_filename.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  local_120.m_file = (FILE *)fsbridge::fopen((char *)&streams_test_filename.super_path,"w+b");
  local_120.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar4 = '\0';
  do {
    local_160.m_src = (AutoFile *)CONCAT71(local_160.m_src._1_7_,cVar4);
    AutoFile::write(&local_120,(int)&local_160,(void *)0x1,in_RCX);
    cVar4 = cVar4 + '\x01';
  } while (cVar4 != '(');
  rewind((FILE *)local_120.m_file);
  local_160.nSrcPos = 0;
  local_160.m_read_pos = 0;
  local_160.nReadLimit = 0xffffffffffffffff;
  local_160.nRewind = 10;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160.m_src = &local_120;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x19);
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start + 0x19;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[3] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[5] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[6] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[7] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[8] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish;
  BufferedFile::SkipTo(&local_160,7);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x193;
  file.m_begin = (iterator)&local_178;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_d8 = &local_1b0;
  local_1b0 = local_160.m_read_pos;
  local_100 = (uint64_t *)&local_1b4;
  local_1b4 = 7;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_160.m_read_pos == 7);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_a8 = "";
  local_b8 = (lazy_ostream *)&local_d8;
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  local_f8.m_message.px = (element_type *)((ulong)local_f8.m_message.px & 0xffffffffffffff00);
  local_f8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  sVar2 = 0x193;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf466bc,(size_t)&local_b0,0x193,&obj,
             "7U",&local_f8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  BufferedFile::read(&local_160,(int)&obj,(void *)0x1,sVar2);
  i = obj;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x195;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_1b0._0_4_ = 7;
  local_d8 = (uint64_t *)&i;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(i == '\a');
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_a8 = "";
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = (lazy_ostream *)&local_d8;
  local_100 = &local_1b0;
  local_f8.m_message.px = (element_type *)((ulong)local_f8.m_message.px & 0xffffffffffffff00);
  local_f8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xeb3827,(size_t)&local_b0,0x195,&obj,
             "7",&local_f8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x648c2a;
  file_01.m_end = (iterator)0x198;
  file_01.m_begin = (iterator)&local_1e8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1f8,
             msg_01);
  uVar3 = (long)local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_160.m_read_pos = 0;
  if (local_160.nSrcPos >= uVar3) {
    local_160.m_read_pos = local_160.nSrcPos - uVar3;
  }
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_160.nSrcPos < uVar3 || local_160.nSrcPos - uVar3 == 0);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "bf.SetPos(0)";
  local_1a8._8_8_ = "";
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_200 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  sVar2 = 0x198;
  local_b8 = (lazy_ostream *)local_1a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)&obj,1,0,WARN,_cVar7,(size_t)&local_208,0x198);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  BufferedFile::read(&local_160,(int)&obj,(void *)0x1,sVar2);
  i = obj;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x19a;
  file_02.m_begin = (iterator)&local_218;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_228,
             msg_02);
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(i == '\0');
  local_1b0._0_4_ = 0;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_a8 = "";
  local_d8 = (uint64_t *)&i;
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = (lazy_ostream *)&local_d8;
  local_100 = &local_1b0;
  local_f8.m_message.px = (element_type *)((ulong)local_f8.m_message.px & 0xffffffffffffff00);
  local_f8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  sVar2 = 0x19a;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xeb3827,(size_t)&local_b0,0x19a,&obj,
             "0",&local_f8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  BufferedFile::read(&local_160,(int)&obj,(void *)0x1,sVar2);
  i = obj;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x19c;
  file_03.m_begin = (iterator)&local_238;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_248,
             msg_03);
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(i == '\x01');
  local_1b0._0_4_ = 1;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_a8 = "";
  local_d8 = (uint64_t *)&i;
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = (lazy_ostream *)&local_d8;
  local_100 = &local_1b0;
  local_f8.m_message.px = (element_type *)((ulong)local_f8.m_message.px & 0xffffffffffffff00);
  local_f8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  sVar2 = 0x19c;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xeb3827,(size_t)&local_b0,0x19c,&obj,
             "1",&local_f8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  BufferedFile::SkipTo(&local_160,0xb);
  BufferedFile::read(&local_160,(int)&obj,(void *)0x1,sVar2);
  i = obj;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1a0;
  file_04.m_begin = (iterator)&local_258;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_268,
             msg_04);
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(i == '\v');
  local_1b0 = CONCAT44(local_1b0._4_4_,0xb);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_a8 = "";
  local_d8 = (uint64_t *)&i;
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = (lazy_ostream *)&local_d8;
  local_100 = &local_1b0;
  local_f8.m_message.px = (element_type *)((ulong)local_f8.m_message.px & 0xffffffffffffff00);
  local_f8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xeb3827,(size_t)&local_b0,0x1a0,&obj,
             "11",&local_f8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  if (local_160.m_read_pos < 0xe) {
    local_160.nReadLimit = 0xd;
  }
  BufferedFile::SkipTo(&local_160,0xe);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x649205;
  file_05.m_end = (iterator)0x1a6;
  file_05.m_begin = (iterator)&local_278;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_288,
             msg_05);
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "false";
  local_1a8._8_8_ = "";
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_290 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_b8 = (lazy_ostream *)local_1a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)&obj,1,0,WARN,_cVar7,(size_t)&local_298,0x1a6);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  BufferedFile::SkipTo(&local_160,0xd);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1ad;
  file_06.m_begin = (iterator)&local_2d8;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2e8,
             msg_06);
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_1b0 = local_160.m_read_pos;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_160.m_read_pos == 0xd);
  local_1b4 = 0xd;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_a8 = "";
  local_d8 = &local_1b0;
  local_c8 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = (lazy_ostream *)&local_d8;
  local_100 = (uint64_t *)&local_1b4;
  local_f8.m_message.px = (element_type *)((ulong)local_f8.m_message.px & 0xffffffffffffff00);
  local_f8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf466bc,(size_t)&local_b0,0x1ad,&obj,
             "13U",&local_f8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  __stream = local_120.m_file;
  local_120.m_file = (FILE *)0x0;
  if ((FILE *)__stream != (FILE *)0x0) {
    fclose((FILE *)__stream);
  }
  std::filesystem::remove((path *)&streams_test_filename);
  if (local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  AutoFile::~AutoFile(&local_120);
  std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file_skip)
{
    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};
    // The value at each offset is the byte offset (e.g. byte 1 in the file has the value 0x01).
    for (uint8_t j = 0; j < 40; ++j) {
        file << j;
    }
    std::rewind(file.Get());

    // The buffer is 25 bytes, allow rewinding 10 bytes.
    BufferedFile bf{file, 25, 10};

    uint8_t i;
    // This is like bf >> (7-byte-variable), in that it will cause data
    // to be read from the file into memory, but it's not copied to us.
    bf.SkipTo(7);
    BOOST_CHECK_EQUAL(bf.GetPos(), 7U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 7);

    // The bytes in the buffer up to offset 7 are valid and can be read.
    BOOST_CHECK(bf.SetPos(0));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    bf.SkipTo(11);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 11);

    // SkipTo() honors the transfer limit; we can't position beyond the limit.
    bf.SetLimit(13);
    try {
        bf.SkipTo(14);
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(), "Attempt to position past buffer limit") != nullptr);
    }

    // We can position exactly to the transfer limit.
    bf.SkipTo(13);
    BOOST_CHECK_EQUAL(bf.GetPos(), 13U);

    file.fclose();
    fs::remove(streams_test_filename);
}